

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

Entry * __thiscall llvm::DWARFUnitIndex::getFromOffset(DWARFUnitIndex *this,uint32_t Offset)

{
  DWARFUnitIndex *pDVar1;
  bool bVar2;
  type pEVar3;
  reference ppEVar4;
  type pSVar5;
  DWARFUnitIndex *in_RCX;
  anon_class_16_2_157720ae P;
  SectionContribution *InfoContrib;
  Entry *E;
  DWARFUnitIndex *local_48;
  DWARFUnitIndex *local_40;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  local_38;
  iterator I;
  type local_28;
  uint local_20;
  undefined1 local_1c [4];
  uint32_t i;
  uint32_t Offset_local;
  DWARFUnitIndex *this_local;
  
  local_1c = (undefined1  [4])Offset;
  _i = this;
  bVar2 = std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
          ::empty(&this->OffsetLookup);
  if (bVar2) {
    for (local_20 = 0; local_20 != (this->Header).NumBuckets; local_20 = local_20 + 1) {
      pEVar3 = std::
               unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
               ::operator[](&this->Rows,(ulong)local_20);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pEVar3->Contributions);
      if (bVar2) {
        local_28 = std::
                   unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                   ::operator[](&this->Rows,(ulong)local_20);
        std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>::
        push_back(&this->OffsetLookup,&local_28);
      }
    }
    in_RCX = this;
    I._M_current = (Entry **)this;
    sort<std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>&,llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>
              (&this->OffsetLookup,(anon_class_8_1_8991fb9c)this);
  }
  local_40 = (DWARFUnitIndex *)local_1c;
  P.Offset = (uint32_t *)in_RCX;
  P.this = local_40;
  local_48 = this;
  local_38._M_current =
       (Entry **)
       partition_point<std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>&,llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__1,llvm::DWARFUnitIndex::Entry*&>
                 ((llvm *)&this->OffsetLookup,
                  (vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
                   *)this,P);
  E = (Entry *)std::
               vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
               ::begin(&this->OffsetLookup);
  bVar2 = __gnu_cxx::operator==
                    (&local_38,
                     (__normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
                      *)&E);
  if (bVar2) {
    this_local = (DWARFUnitIndex *)0x0;
  }
  else {
    __gnu_cxx::
    __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
    ::operator--(&local_38);
    ppEVar4 = __gnu_cxx::
              __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
              ::operator*(&local_38);
    pDVar1 = (DWARFUnitIndex *)*ppEVar4;
    pSVar5 = std::
             unique_ptr<llvm::DWARFUnitIndex::Entry::SectionContribution[],_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
             ::operator[]((unique_ptr<llvm::DWARFUnitIndex::Entry::SectionContribution[],_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                           *)&pDVar1->InfoColumnKind,(long)this->InfoColumn);
    this_local = pDVar1;
    if (pSVar5->Offset + pSVar5->Length <= (uint)local_1c) {
      this_local = (DWARFUnitIndex *)0x0;
    }
  }
  return (Entry *)this_local;
}

Assistant:

const DWARFUnitIndex::Entry *
DWARFUnitIndex::getFromOffset(uint32_t Offset) const {
  if (OffsetLookup.empty()) {
    for (uint32_t i = 0; i != Header.NumBuckets; ++i)
      if (Rows[i].Contributions)
        OffsetLookup.push_back(&Rows[i]);
    llvm::sort(OffsetLookup, [&](Entry *E1, Entry *E2) {
      return E1->Contributions[InfoColumn].Offset <
             E2->Contributions[InfoColumn].Offset;
    });
  }
  auto I = partition_point(OffsetLookup, [&](Entry *E2) {
    return E2->Contributions[InfoColumn].Offset <= Offset;
  });
  if (I == OffsetLookup.begin())
    return nullptr;
  --I;
  const auto *E = *I;
  const auto &InfoContrib = E->Contributions[InfoColumn];
  if ((InfoContrib.Offset + InfoContrib.Length) <= Offset)
    return nullptr;
  return E;
}